

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

MultiplyLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_multiply(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  MultiplyLayerParams *pMVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_multiply(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_multiply(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pMVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::MultiplyLayerParams>(arena);
    (this->layer_).multiply_ = pMVar2;
  }
  return (MultiplyLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::MultiplyLayerParams* NeuralNetworkLayer::_internal_mutable_multiply() {
  if (!_internal_has_multiply()) {
    clear_layer();
    set_has_multiply();
    layer_.multiply_ = CreateMaybeMessage< ::CoreML::Specification::MultiplyLayerParams >(GetArenaForAllocation());
  }
  return layer_.multiply_;
}